

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::MseWxHTest_RefMse_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::MseWxHTest_RefMse_Test> *this)

{
  MseWxHTestClass<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int,_int)> *this_00
  ;
  
  WithParamInterface<(anonymous_namespace)::TestParams<unsigned_long(*)(unsigned_char*,int,unsigned_short*,int,int,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (MseWxHTestClass<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int,_int)>
             *)operator_new(0x60);
  anon_unknown.dwarf_1d6630d::
  MseWxHTestClass<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int,_int)>::
  MseWxHTestClass(this_00);
  (this_00->
  super_TestWithParam<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int,_int)>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f668f0;
  (this_00->
  super_TestWithParam<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int,_int)>_>
  ).
  super_WithParamInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int,_int)>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__MseWxHTest_RefMse_Test_00f66930;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }